

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O1

void __thiscall Inst::print(Inst *this,ostream *o)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  
  operator<<(o,&this->tag_);
  std::__ostream_insert<char,std::char_traits<char>>(o,"(",1);
  uVar1 = (int)((long)(this->args).super__Vector_base<Arg,_std::allocator<Arg>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->args).super__Vector_base<Arg,_std::allocator<Arg>_>._M_impl.
                      super__Vector_impl_data._M_start >> 4) * -0x55555555;
  if (0 < (int)uVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      Arg::print((Arg *)((long)&(((this->args).super__Vector_base<Arg,_std::allocator<Arg>_>._M_impl
                                  .super__Vector_impl_data._M_start)->f_).id._M_dataplus + lVar3),o)
      ;
      if ((long)uVar2 < (long)(int)(uVar1 - 1)) {
        std::__ostream_insert<char,std::char_traits<char>>(o,",",1);
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x30;
    } while ((uVar1 & 0x7fffffff) != uVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,")",1);
  return;
}

Assistant:

void print(std::ostream &o) const  {
        o << tag_;
        o << "(";
        const int n = args.size();
        for(int i = 0; i < n; ++i) {
            o << args[i];
            if (i < n - 1) o << ",";
        }
        o << ")";
    }